

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O3

FaceData * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
get(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *this,
   ReductionKey *key)

{
  Entry *pEVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  do {
    pEVar1 = this->_entries;
  } while (pEVar1 == (Entry *)0x0);
  uVar3 = this->_numEntries - 1;
  uVar5 = (uint)key->_val;
  uVar4 = (ulong)(uVar3 & uVar5);
  lVar2 = pEVar1[uVar4].key._val;
  while( true ) {
    if (lVar2 == key->_val) {
      return pEVar1[uVar4].value;
    }
    uVar5 = uVar5 + 1;
    if (pEVar1[uVar4].value == (FaceData *)0x0) break;
    uVar4 = (ulong)(uVar5 & uVar3);
    lVar2 = pEVar1[uVar4].key._val;
  }
  return (FaceData *)0x0;
}

Assistant:

Value get(Key& key)
    {
        uint32_t mask = _numEntries-1;
        Entry* entries = getEntries();
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
            if (e.value == 0) {
                break;
            }
        }

        return result;
    }